

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<unsigned_int,unsigned_int,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::NotEquals,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  bool bVar1;
  uint *puVar2;
  uint *puVar3;
  bool *pbVar4;
  undefined1 in_CL;
  Vector *in_RDX;
  Vector *in_RSI;
  bool in_stack_0000000f;
  bool *result_data;
  uint *rdata;
  uint *ldata;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar5;
  uint uVar6;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar7;
  
  Vector::SetVectorType(in_RSI,(VectorType)((ulong)in_RDX >> 0x38));
  puVar2 = ConstantVector::GetData<unsigned_int>((Vector *)0x503ed4);
  puVar3 = ConstantVector::GetData<unsigned_int>((Vector *)0x503ee3);
  pbVar4 = ConstantVector::GetData<bool>((Vector *)0x503ef2);
  bVar1 = ConstantVector::IsNull((Vector *)0x503f01);
  if ((!bVar1) && (bVar1 = ConstantVector::IsNull((Vector *)0x503f0f), !bVar1)) {
    uVar7 = CONCAT13(in_CL,(int3)in_stack_ffffffffffffffc4) & 0x1ffffff;
    uVar5 = *puVar2;
    uVar6 = *puVar3;
    ConstantVector::Validity(in_RDX);
    bVar1 = BinarySingleArgumentOperatorWrapper::
            Operation<bool,duckdb::NotEquals,unsigned_int,unsigned_int,bool>
                      (SUB81((ulong)puVar3 >> 0x38,0),(uint)puVar3,(uint)((ulong)pbVar4 >> 0x20),
                       (ValidityMask *)CONCAT44(uVar7,uVar6),
                       CONCAT44(uVar5,in_stack_ffffffffffffffb8));
    *pbVar4 = bVar1;
    return;
  }
  ConstantVector::SetNull((Vector *)result_data,in_stack_0000000f);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}